

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cpp
# Opt level: O3

void CheapTrick(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
               CheapTrickOption *option,double **spectrogram)

{
  bool bVar1;
  double dVar2;
  double f0_00;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 *puVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  fft_plan *pfVar23;
  ulong uVar24;
  undefined8 *puVar25;
  long lVar26;
  ulong uVar27;
  int i;
  ulong uVar28;
  byte bVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  int iVar39;
  RandnState randn_state;
  ForwardRealFFT forward_real_fft;
  InverseRealFFT inverse_real_fft;
  undefined8 auStackY_228 [5];
  undefined1 in_stack_fffffffffffffe00 [40];
  uint in_stack_fffffffffffffe3c;
  undefined4 uVar40;
  uint fft_size;
  undefined4 uVar41;
  RandnState local_108;
  ForwardRealFFT local_f8;
  InverseRealFFT local_98;
  
  bVar29 = 0;
  fft_size = option->fft_size;
  local_108.g_randn_x = 0;
  local_108.g_randn_y = 0;
  local_108.g_randn_z = 0;
  local_108.g_randn_w = 0;
  randn_reseed(&local_108);
  uVar24 = (long)(int)fft_size * 8;
  if ((long)(int)fft_size < 0) {
    uVar24 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar24);
  local_f8.forward_fft.ip = (int *)0x0;
  local_f8.forward_fft.w = (double *)0x0;
  local_f8.forward_fft.out = (double *)0x0;
  local_f8.forward_fft.input = (double *)0x0;
  local_f8.forward_fft.in = (double *)0x0;
  local_f8.forward_fft.c_out = (fft_complex *)0x0;
  local_f8.forward_fft.flags = 0;
  local_f8.forward_fft._12_4_ = 0;
  local_f8.forward_fft.c_in = (fft_complex *)0x0;
  local_f8.spectrum = (fft_complex *)0x0;
  local_f8.forward_fft.n = 0;
  local_f8.forward_fft.sign = 0;
  local_f8.fft_size = 0;
  local_f8._4_4_ = 0;
  local_f8.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size,&local_f8);
  local_98.inverse_fft.ip = (int *)0x0;
  local_98.inverse_fft.w = (double *)0x0;
  local_98.inverse_fft.out = (double *)0x0;
  local_98.inverse_fft.input = (double *)0x0;
  local_98.inverse_fft.in = (double *)0x0;
  local_98.inverse_fft.c_out = (fft_complex *)0x0;
  local_98.inverse_fft.flags = 0;
  local_98.inverse_fft._12_4_ = 0;
  local_98.inverse_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.inverse_fft.n = 0;
  local_98.inverse_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeInverseRealFFT(fft_size,&local_98);
  dVar32 = (double)((ulong)in_stack_fffffffffffffe3c << 0x20);
  if (0 < f0_length) {
    dVar31 = (double)fs;
    uVar15 = (ulong)fft_size;
    dVar38 = (double)(int)fft_size;
    iVar5 = fft_size - 2;
    uVar6 = (int)fft_size / 2;
    uVar16 = (ulong)(uVar6 + 1);
    uVar24 = uVar15 * 8;
    if ((int)fft_size < 0) {
      uVar24 = 0xffffffffffffffff;
    }
    uVar19 = 2;
    if (2 < (int)uVar6) {
      uVar19 = (ulong)uVar6;
    }
    uVar41 = 0;
    uVar21 = 0;
    uVar20 = uVar16;
    do {
      uVar30 = -(ulong)((dVar31 * 3.0) / (dVar38 + -3.0) < f0[uVar21]);
      f0_00 = (double)(~uVar30 & 0x407f400000000000 | (ulong)f0[uVar21] & uVar30);
      dVar35 = temporal_positions[uVar21];
      dVar34 = option->q1;
      dVar2 = (dVar31 * 1.5) / f0_00;
      uVar7 = matlab_round(dVar2);
      uVar40 = (undefined4)((ulong)dVar32 >> 0x20);
      uVar6 = uVar7 * 2;
      lVar26 = (long)(int)(uVar7 * 2 + 1);
      uVar30 = lVar26 * 4;
      uVar27 = lVar26 << 3;
      if ((int)uVar7 < 0) {
        uVar30 = 0xffffffffffffffff;
        uVar27 = 0xffffffffffffffff;
      }
      pvVar10 = operator_new__(uVar30);
      pvVar11 = operator_new__(uVar30);
      pvVar12 = operator_new__(uVar27);
      auVar4 = _DAT_0010d320;
      auVar3 = _DAT_0010d310;
      uVar30 = (ulong)uVar6;
      if ((int)uVar7 < 0) {
        matlab_round(dVar35 * dVar31 + 0.001);
      }
      else {
        lVar26 = (ulong)uVar7 * 4 + (long)(int)uVar7 * -4;
        lVar22 = 0;
        do {
          iVar8 = (int)lVar22;
          auVar36._8_4_ = iVar8;
          auVar36._0_8_ = lVar22;
          auVar36._12_4_ = (int)((ulong)lVar22 >> 0x20);
          auVar37._4_4_ = 0;
          auVar37._0_4_ = uVar6;
          auVar37._8_4_ = uVar6;
          auVar37._12_4_ = 0;
          auVar37 = auVar37 ^ auVar4;
          auVar36 = (auVar36 | auVar3) ^ auVar4;
          bVar1 = auVar37._0_4_ < auVar36._0_4_;
          iVar18 = auVar37._4_4_;
          iVar39 = auVar36._4_4_;
          if ((bool)(~(iVar18 < iVar39 || iVar39 == iVar18 && bVar1) & 1)) {
            *(uint *)((long)pvVar10 + lVar22 * 4 + lVar26) = -uVar7 + iVar8;
          }
          if (iVar18 >= iVar39 && (iVar39 != iVar18 || !bVar1)) {
            *(uint *)((long)pvVar10 + lVar22 * 4 + lVar26 + 4) = -uVar7 + iVar8 + 1;
          }
          lVar22 = lVar22 + 2;
        } while (uVar30 + 2 != lVar22);
        iVar8 = matlab_round(dVar35 * dVar31 + 0.001);
        uVar7 = 0;
        if (0 < (int)uVar6) {
          uVar7 = uVar6;
        }
        uVar27 = (ulong)(uVar7 | 1);
        uVar16 = 0;
        do {
          iVar18 = *(int *)((long)pvVar10 + uVar16 * 4) + iVar8;
          if (iVar18 < 1) {
            iVar18 = 0;
          }
          if (x_length + -1 < iVar18) {
            iVar18 = x_length + -1;
          }
          *(int *)((long)pvVar11 + uVar16 * 4) = iVar18;
          uVar16 = uVar16 + 1;
        } while (uVar27 != uVar16);
        dVar32 = 0.0;
        uVar28 = 0;
        uVar16 = uVar20;
        do {
          dVar35 = dVar32;
          dVar32 = cos((((double)*(int *)((long)pvVar10 + uVar28 * 4) / 1.5) / dVar31) *
                       3.141592653589793 * f0_00);
          dVar32 = dVar32 * 0.5 + 0.5;
          *(double *)((long)pvVar12 + uVar28 * 8) = dVar32;
          dVar32 = dVar35 + dVar32 * dVar32;
          uVar28 = uVar28 + 1;
        } while (uVar27 != uVar28);
        if (dVar32 < 0.0) {
          dVar32 = sqrt(dVar32);
        }
        else {
          dVar32 = SQRT(dVar32);
        }
        uVar28 = 0;
        do {
          *(double *)((long)pvVar12 + uVar28 * 8) = *(double *)((long)pvVar12 + uVar28 * 8) / dVar32
          ;
          uVar28 = uVar28 + 1;
          uVar20 = uVar16;
        } while (uVar27 != uVar28);
      }
      pdVar14 = local_f8.waveform;
      uVar7 = fft_size;
      if (-1 < (int)uVar6) {
        lVar26 = 0;
        uVar6 = (uint)pvVar12;
        uVar40 = (undefined4)((ulong)pvVar12 >> 0x20);
        uVar16 = uVar20;
        do {
          dVar35 = x[*(int *)((long)pvVar11 + lVar26 * 4)] *
                   *(double *)(CONCAT44(uVar40,uVar6) + lVar26 * 8);
          dVar32 = randn(&local_108);
          pdVar14[lVar26] = dVar32 * 1e-12 + dVar35;
          lVar26 = lVar26 + 1;
        } while (uVar30 + 1 != lVar26);
        dVar33 = 0.0;
        lVar26 = 0;
        dVar32 = 0.0;
        pvVar12 = (void *)CONCAT44(uVar40,uVar6);
        do {
          dVar32 = dVar32 + pdVar14[lVar26];
          dVar33 = dVar33 + *(double *)((long)pvVar12 + lVar26 * 8);
          lVar26 = lVar26 + 1;
        } while (uVar30 + 1 != lVar26);
        lVar26 = 0;
        do {
          pdVar14[lVar26] =
               pdVar14[lVar26] - *(double *)((long)pvVar12 + lVar26 * 8) * (dVar32 / dVar33);
          lVar26 = lVar26 + 1;
          uVar20 = uVar16;
          uVar7 = fft_size;
        } while (uVar30 + 1 != lVar26);
      }
      operator_delete__(pvVar10);
      operator_delete__(pvVar11);
      operator_delete__(pvVar12);
      iVar8 = matlab_round(dVar2);
      if (iVar8 * 2 + 1 < (int)uVar7) {
        memset(local_f8.waveform + (long)(iVar8 * 2) + 1,0,(ulong)(uint)(iVar5 + iVar8 * -2) * 8 + 8
              );
      }
      pfVar23 = &local_f8.forward_fft;
      puVar13 = auStackY_228;
      for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar13 = *(undefined8 *)pfVar23;
        pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
        puVar13 = puVar13 + (ulong)bVar29 * -2 + 1;
      }
      p.out = (double *)dVar35;
      p.n = in_stack_fffffffffffffe00._0_4_;
      p.sign = in_stack_fffffffffffffe00._4_4_;
      p.flags = in_stack_fffffffffffffe00._8_4_;
      p._12_4_ = in_stack_fffffffffffffe00._12_4_;
      p.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
      p.in = (double *)in_stack_fffffffffffffe00._24_8_;
      p.c_out = (fft_complex *)in_stack_fffffffffffffe00._32_8_;
      p.input = (double *)uVar20;
      p.ip._0_4_ = uVar6;
      p.ip._4_4_ = uVar40;
      p.w._0_4_ = uVar7;
      p.w._4_4_ = uVar41;
      fft_execute(p);
      if (-2 < (int)uVar7) {
        pdVar14 = *local_f8.spectrum + 1;
        uVar30 = 0;
        do {
          local_f8.waveform[uVar30] =
               (*(fft_complex *)(pdVar14 + -1))[0] * (*(fft_complex *)(pdVar14 + -1))[0] +
               *pdVar14 * *pdVar14;
          uVar30 = uVar30 + 1;
          pdVar14 = pdVar14 + 2;
        } while (uVar16 != uVar30);
      }
      fft_size = uVar7;
      DCCorrection(local_f8.waveform,f0_00,fs,uVar7,local_f8.waveform);
      LinearSmoothing(local_f8.waveform,(f0_00 + f0_00) / 3.0,fs,uVar7,local_f8.waveform);
      pdVar14 = local_f8.waveform;
      if (-2 < (int)uVar7) {
        uVar30 = 0;
        do {
          dVar35 = pdVar14[uVar30];
          dVar32 = randn(&local_108);
          pdVar14[uVar30] = ABS(dVar32) * 2.220446049250313e-16 + dVar35;
          uVar30 = uVar30 + 1;
        } while (uVar16 != uVar30);
      }
      puVar13 = (undefined8 *)operator_new__(uVar24);
      pdVar14 = (double *)operator_new__(uVar24);
      dVar32 = (double)CONCAT44(uVar40,uVar6);
      *puVar13 = 0x3ff0000000000000;
      dVar34 = dVar34 + dVar34;
      *pdVar14 = dVar34 + (1.0 - dVar34);
      if (1 < local_f8.fft_size) {
        lVar26 = 1;
        do {
          dVar35 = (double)(int)lVar26 / dVar31;
          dVar32 = f0_00 * 3.141592653589793 * dVar35;
          dVar2 = sin(dVar32);
          puVar13[lVar26] = dVar2 / dVar32;
          dVar2 = cos(dVar35 * 6.283185307179586 * f0_00);
          pdVar14[lVar26] = dVar2 * dVar34 + (1.0 - dVar34);
          bVar1 = lVar26 < local_f8.fft_size / 2;
          lVar26 = lVar26 + 1;
        } while (bVar1);
      }
      uVar16 = uVar20;
      if ((int)fft_size < -1) {
        lVar26 = 9;
        pfVar23 = &local_f8.forward_fft;
        puVar25 = auStackY_228;
        while( true ) {
          if (lVar26 == 0) break;
          lVar26 = lVar26 + -1;
          *puVar25 = *(undefined8 *)pfVar23;
          pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
          puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        }
        p_00.out = (double *)dVar35;
        p_00.n = in_stack_fffffffffffffe00._0_4_;
        p_00.sign = in_stack_fffffffffffffe00._4_4_;
        p_00.flags = in_stack_fffffffffffffe00._8_4_;
        p_00._12_4_ = in_stack_fffffffffffffe00._12_4_;
        p_00.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
        p_00.in = (double *)in_stack_fffffffffffffe00._24_8_;
        p_00.c_out = (fft_complex *)in_stack_fffffffffffffe00._32_8_;
        p_00.input = (double *)uVar16;
        p_00.ip._0_4_ = SUB84(dVar32,0);
        p_00.ip._4_4_ = (int)((ulong)dVar32 >> 0x20);
        p_00.w._0_4_ = fft_size;
        p_00.w._4_4_ = uVar41;
        fft_execute(p_00);
        lVar26 = 9;
        pfVar23 = &local_98.inverse_fft;
        puVar25 = auStackY_228;
        while( true ) {
          if (lVar26 == 0) break;
          lVar26 = lVar26 + -1;
          *puVar25 = *(undefined8 *)pfVar23;
          pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
          puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        }
        p_01.out = (double *)dVar35;
        p_01.n = in_stack_fffffffffffffe00._0_4_;
        p_01.sign = in_stack_fffffffffffffe00._4_4_;
        p_01.flags = in_stack_fffffffffffffe00._8_4_;
        p_01._12_4_ = in_stack_fffffffffffffe00._12_4_;
        p_01.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
        p_01.in = (double *)in_stack_fffffffffffffe00._24_8_;
        p_01.c_out = (fft_complex *)in_stack_fffffffffffffe00._32_8_;
        p_01.input = (double *)uVar16;
        p_01.ip._0_4_ = SUB84(dVar32,0);
        p_01.ip._4_4_ = (int)((ulong)dVar32 >> 0x20);
        p_01.w._0_4_ = fft_size;
        p_01.w._4_4_ = uVar41;
        fft_execute(p_01);
        uVar20 = uVar16;
      }
      else {
        uVar30 = 0;
        do {
          dVar34 = log(local_f8.waveform[uVar30]);
          local_f8.waveform[uVar30] = dVar34;
          uVar30 = uVar30 + 1;
        } while (uVar20 != uVar30);
        if (3 < (int)fft_size) {
          pdVar17 = local_f8.waveform + (uVar15 - 1);
          uVar20 = 1;
          do {
            *pdVar17 = local_f8.waveform[uVar20];
            uVar20 = uVar20 + 1;
            pdVar17 = pdVar17 + -1;
          } while (uVar19 != uVar20);
        }
        lVar26 = 9;
        pfVar23 = &local_f8.forward_fft;
        puVar25 = auStackY_228;
        while( true ) {
          if (lVar26 == 0) break;
          lVar26 = lVar26 + -1;
          *puVar25 = *(undefined8 *)pfVar23;
          pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
          puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        }
        p_02.out = (double *)dVar35;
        p_02.n = in_stack_fffffffffffffe00._0_4_;
        p_02.sign = in_stack_fffffffffffffe00._4_4_;
        p_02.flags = in_stack_fffffffffffffe00._8_4_;
        p_02._12_4_ = in_stack_fffffffffffffe00._12_4_;
        p_02.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
        p_02.in = (double *)in_stack_fffffffffffffe00._24_8_;
        p_02.c_out = (fft_complex *)in_stack_fffffffffffffe00._32_8_;
        p_02.input = (double *)uVar16;
        p_02.ip._0_4_ = SUB84(dVar32,0);
        p_02.ip._4_4_ = (int)((ulong)dVar32 >> 0x20);
        p_02.w._0_4_ = fft_size;
        p_02.w._4_4_ = uVar41;
        fft_execute(p_02);
        lVar26 = 0;
        uVar20 = uVar16;
        do {
          *(double *)((long)*local_98.spectrum + lVar26 * 2) =
               (*(double *)((long)*local_f8.spectrum + lVar26 * 2) *
                *(double *)((long)puVar13 + lVar26) * *(double *)((long)pdVar14 + lVar26)) / dVar38;
          *(undefined8 *)((long)*local_98.spectrum + lVar26 * 2 + 8) = 0;
          lVar26 = lVar26 + 8;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
        lVar26 = 9;
        pfVar23 = &local_98.inverse_fft;
        puVar25 = auStackY_228;
        while( true ) {
          if (lVar26 == 0) break;
          lVar26 = lVar26 + -1;
          *puVar25 = *(undefined8 *)pfVar23;
          pfVar23 = (fft_plan *)((long)pfVar23 + ((ulong)bVar29 * -2 + 1) * 8);
          puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
        }
        p_03.out = (double *)dVar35;
        p_03.n = in_stack_fffffffffffffe00._0_4_;
        p_03.sign = in_stack_fffffffffffffe00._4_4_;
        p_03.flags = in_stack_fffffffffffffe00._8_4_;
        p_03._12_4_ = in_stack_fffffffffffffe00._12_4_;
        p_03.c_in = (fft_complex *)in_stack_fffffffffffffe00._16_8_;
        p_03.in = (double *)in_stack_fffffffffffffe00._24_8_;
        p_03.c_out = (fft_complex *)in_stack_fffffffffffffe00._32_8_;
        p_03.input = (double *)uVar16;
        p_03.ip._0_4_ = SUB84(dVar32,0);
        p_03.ip._4_4_ = (int)((ulong)dVar32 >> 0x20);
        p_03.w._0_4_ = fft_size;
        p_03.w._4_4_ = uVar41;
        fft_execute(p_03);
        uVar30 = 0;
        uVar20 = uVar16;
        do {
          dVar34 = exp(local_98.waveform[uVar30]);
          *(double *)((long)pvVar9 + uVar30 * 8) = dVar34;
          uVar30 = uVar30 + 1;
        } while (uVar16 != uVar30);
      }
      operator_delete__(puVar13);
      operator_delete__(pdVar14);
      if (-2 < (int)fft_size) {
        pdVar14 = spectrogram[uVar21];
        uVar30 = 0;
        do {
          pdVar14[uVar30] = *(double *)((long)pvVar9 + uVar30 * 8);
          uVar30 = uVar30 + 1;
        } while (uVar16 != uVar30);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)f0_length);
  }
  DestroyForwardRealFFT(&local_f8);
  DestroyInverseRealFFT(&local_98);
  operator_delete__(pvVar9);
  return;
}

Assistant:

void CheapTrick(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    const CheapTrickOption *option, double **spectrogram) {
  int fft_size = option->fft_size;

  RandnState randn_state = {};
  randn_reseed(&randn_state);

  double f0_floor = GetF0FloorForCheapTrick(fs, fft_size);
  double *spectral_envelope = new double[fft_size];

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size, &forward_real_fft);
  InverseRealFFT inverse_real_fft = {0};
  InitializeInverseRealFFT(fft_size, &inverse_real_fft);

  double current_f0;
  for (int i = 0; i < f0_length; ++i) {
    current_f0 = f0[i] <= f0_floor ? world::kDefaultF0 : f0[i];
    CheapTrickGeneralBody(x, x_length, fs, current_f0, fft_size,
        temporal_positions[i], option->q1, &forward_real_fft,
        &inverse_real_fft, spectral_envelope, &randn_state);
    for (int j = 0; j <= fft_size / 2; ++j)
      spectrogram[i][j] = spectral_envelope[j];
  }

  DestroyForwardRealFFT(&forward_real_fft);
  DestroyInverseRealFFT(&inverse_real_fft);
  delete[] spectral_envelope;
}